

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyVeryFast(QHttpNetworkReplyPrivate *this,QIODevice *socket,char *b)

{
  qint64 qVar1;
  long lVar2;
  
  qVar1 = QIODevice::read((char *)socket,(longlong)b);
  if (qVar1 == -1) {
    qVar1 = -1;
  }
  else {
    lVar2 = this->contentRead + qVar1;
    this->contentRead = lVar2;
    if (lVar2 == this->bodyLength) {
      this->state = AllDoneState;
    }
  }
  return qVar1;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyVeryFast(QIODevice *socket, char *b)
{
    // This first read is to flush the buffer inside the socket
    qint64 haveRead = 0;
    haveRead = socket->read(b, bodyLength - contentRead);
    if (haveRead == -1) {
        return -1;
    }
    contentRead += haveRead;

    if (contentRead == bodyLength) {
        state = AllDoneState;
    }

    return haveRead;
}